

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_def.c
# Opt level: O0

FIELD * new_field(int rows,int cols,int frow,int fcol,int nrow,int nbuf)

{
  _Bool _Var1;
  size_t __size;
  char *pcVar2;
  int *piVar3;
  int local_44;
  int i;
  size_t len;
  FIELD *pFStack_30;
  int err;
  FIELD *New_Field;
  int nbuf_local;
  int nrow_local;
  int fcol_local;
  int frow_local;
  int cols_local;
  int rows_local;
  
  pFStack_30 = (FIELD *)0x0;
  len._4_4_ = -2;
  if ((((0 < rows) && (0 < cols)) && (-1 < frow)) && (((-1 < fcol && (-1 < nrow)) && (-1 < nbuf))))
  {
    len._4_4_ = -1;
    pFStack_30 = (FIELD *)malloc(0x78);
    if (pFStack_30 != (FIELD *)0x0) {
      memcpy(pFStack_30,&default_field,0x78);
      pFStack_30->rows = (short)rows;
      pFStack_30->cols = (short)cols;
      pFStack_30->drows = rows + nrow;
      pFStack_30->dcols = cols;
      pFStack_30->frow = (short)frow;
      pFStack_30->fcol = (short)fcol;
      pFStack_30->nrow = nrow;
      pFStack_30->nbuf = (short)nbuf;
      pFStack_30->link = pFStack_30;
      _Var1 = _nc_Copy_Type(pFStack_30,&default_field);
      if (_Var1) {
        __size = (size_t)((pFStack_30->drows * pFStack_30->dcols + 1) * (pFStack_30->nbuf + 1));
        pcVar2 = (char *)malloc(__size);
        pFStack_30->buf = pcVar2;
        if (pcVar2 != (char *)0x0) {
          memset(pFStack_30->buf,0x20,__size);
          for (local_44 = 0; local_44 <= pFStack_30->nbuf; local_44 = local_44 + 1) {
            pFStack_30->buf[(pFStack_30->drows * (int)pFStack_30->cols + 1) * (local_44 + 1) + -1] =
                 '\0';
          }
          return pFStack_30;
        }
      }
    }
  }
  if (pFStack_30 != (FIELD *)0x0) {
    free_field(pFStack_30);
  }
  piVar3 = __errno_location();
  *piVar3 = len._4_4_;
  return (FIELD *)0x0;
}

Assistant:

FIELD *new_field(int rows, int cols, int frow, int fcol, int nrow, int nbuf)
{
  FIELD *New_Field = (FIELD *)0;
  int err = E_BAD_ARGUMENT;

  if (rows>0  && 
      cols>0  && 
      frow>=0 && 
      fcol>=0 && 
      nrow>=0 && 
      nbuf>=0 &&
      ((err = E_SYSTEM_ERROR) != 0) && /* trick: this resets the default error */
      (New_Field=(FIELD *)malloc(sizeof(FIELD))) )
    {
      *New_Field       = default_field;
      New_Field->rows  = rows;
      New_Field->cols  = cols;
      New_Field->drows = rows + nrow;
      New_Field->dcols = cols;
      New_Field->frow  = frow;
      New_Field->fcol  = fcol;
      New_Field->nrow  = nrow;
      New_Field->nbuf  = nbuf;
      New_Field->link  = New_Field;

      if (_nc_Copy_Type(New_Field,&default_field))
	{
	  size_t len;

	  len = Total_Buffer_Size(New_Field);
	  if ((New_Field->buf = (char *)malloc(len)))
	    {
	      /* Prefill buffers with blanks and insert terminating zeroes
		 between buffers */
	      int i;

	      memset(New_Field->buf,' ',len);
	      for(i=0;i<=New_Field->nbuf;i++)
		{
		  New_Field->buf[(New_Field->drows*New_Field->cols+1)*(i+1)-1]
		    = '\0';
		}
	      return New_Field;
	    }
	}
    }

  if (New_Field) 
    free_field(New_Field);
  
  SET_ERROR( err );
  return (FIELD *)0;
}